

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  uint uVar1;
  _func_int *p_Var2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Layer *pLVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  Mat *this_00;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined4 *puVar24;
  ulong uVar25;
  bool bVar26;
  Option opt_cpu;
  ParamDict pd;
  
  opt_cpu.lightmode = opt->lightmode;
  opt_cpu._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_cpu.num_threads = opt->num_threads;
  opt_cpu.blob_allocator._0_4_ = *(undefined4 *)&opt->blob_allocator;
  opt_cpu.blob_allocator._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  opt_cpu.workspace_allocator = opt->workspace_allocator;
  uVar12._0_1_ = opt->vulkan_compute;
  uVar12._1_3_ = *(undefined3 *)&opt->field_0x19;
  uVar12._4_4_ = opt->use_winograd_convolution;
  opt_cpu.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_cpu.use_int8_inference = opt->use_int8_inference;
  opt_cpu._24_8_ = uVar12 & 0xffffffffffffff00;
  switch(*(undefined4 *)(&this->field_0xb0 + (long)this->_vptr_Convolution_x86[-3])) {
  case 1:
    pLVar10 = create_layer(0x1a);
    this->activation = pLVar10;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 2:
    pLVar10 = create_layer(0x1a);
    this->activation = pLVar10;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]));
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 3:
    pLVar10 = create_layer(0x36);
    this->activation = pLVar10;
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)(&this->field_0xb8 + (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd,1,*(float *)(*(long *)(&this->field_0xb8 +
                                             (long)this->_vptr_Convolution_x86[-3]) + 4));
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  case 4:
    pLVar10 = create_layer(0x1e);
    this->activation = pLVar10;
    ParamDict::ParamDict(&pd);
    (*this->activation->_vptr_Layer[2])(this->activation,&pd);
    break;
  default:
    goto switchD_00118aae_default;
  }
  ParamDict::~ParamDict(&pd);
switchD_00118aae_default:
  pLVar10 = this->activation;
  if (pLVar10 != (Layer *)0x0) {
    (*pLVar10->_vptr_Layer[4])(pLVar10,&opt_cpu);
  }
  this->use_winograd3x3 = false;
  p_Var2 = this->_vptr_Convolution_x86[-3];
  if ((&this->field_0x1c0)[(long)p_Var2] == '\0') {
    iVar22 = *(int *)(p_Var2 + 0x2c + (long)&(this->weight_sgemm_data).data) *
             *(int *)(p_Var2 + 0x30 + (long)&(this->weight_sgemm_data).data);
    uVar1 = *(uint *)(p_Var2 + 0x28 + (long)&(this->weight_sgemm_data).data);
    uVar12 = (long)*(int *)(&this->field_0xa8 + (long)p_Var2) / (long)iVar22;
    iVar9 = (int)((long)((ulong)(uint)((int)uVar12 >> 0x1f) << 0x20 | uVar12 & 0xffffffff) /
                 (long)(int)uVar1);
    lVar3 = *(long *)(&this->field_0xf8 + (long)p_Var2);
    this_00 = &this->weight_sgemm_data;
    uVar12 = 0;
    Mat::create(this_00,iVar22 * 8,iVar9,
                (int)uVar1 / 8 + (int)uVar1 % 4 + (int)(char)((char)((int)uVar1 % 8) / '\x04'),4,
                (Allocator *)0x0);
    iVar23 = iVar9 * iVar22;
    iVar5 = 0;
    if (0 < iVar23) {
      iVar5 = iVar23;
    }
    uVar25 = (ulong)(uint)((int)uVar1 >> 3);
    if ((int)uVar1 >> 3 < 1) {
      uVar25 = uVar12;
    }
    iVar6 = iVar23 * 8;
    iVar15 = iVar23 * 2;
    iVar16 = iVar23 * 3;
    iVar17 = iVar23 * 4;
    iVar18 = iVar23 * 5;
    iVar19 = iVar23 * 6;
    iVar20 = iVar23 * 7;
    iVar21 = iVar23;
    for (uVar14 = 0; uVar14 != uVar25; uVar14 = uVar14 + 1) {
      Mat::channel((Mat *)&pd,this_00,(int)uVar14);
      uVar4 = pd.params[0]._0_8_;
      Mat::~Mat((Mat *)&pd);
      lVar11 = 0;
      iVar7 = iVar5;
      while (bVar26 = iVar7 != 0, iVar7 = iVar7 + -1, bVar26) {
        *(undefined4 *)(uVar4 + lVar11 * 8) =
             *(undefined4 *)(lVar3 + (long)(int)uVar12 * 4 + lVar11);
        *(undefined4 *)(uVar4 + 4 + lVar11 * 8) = *(undefined4 *)(lVar3 + (long)iVar21 * 4 + lVar11)
        ;
        *(undefined4 *)(uVar4 + 8 + lVar11 * 8) = *(undefined4 *)(lVar3 + (long)iVar15 * 4 + lVar11)
        ;
        *(undefined4 *)(uVar4 + 0xc + lVar11 * 8) =
             *(undefined4 *)(lVar3 + (long)iVar16 * 4 + lVar11);
        *(undefined4 *)(uVar4 + 0x10 + lVar11 * 8) =
             *(undefined4 *)(lVar3 + (long)iVar17 * 4 + lVar11);
        *(undefined4 *)(uVar4 + 0x14 + lVar11 * 8) =
             *(undefined4 *)(lVar3 + (long)iVar18 * 4 + lVar11);
        *(undefined4 *)(uVar4 + 0x18 + lVar11 * 8) =
             *(undefined4 *)(lVar3 + (long)iVar19 * 4 + lVar11);
        *(undefined4 *)(uVar4 + 0x1c + lVar11 * 8) =
             *(undefined4 *)(lVar3 + (long)iVar20 * 4 + lVar11);
        lVar11 = lVar11 + 4;
      }
      uVar12 = (ulong)(uint)((int)uVar12 + iVar6);
      iVar21 = iVar21 + iVar6;
      iVar15 = iVar15 + iVar6;
      iVar16 = iVar16 + iVar6;
      iVar17 = iVar17 + iVar6;
      iVar18 = iVar18 + iVar6;
      iVar19 = iVar19 + iVar6;
      iVar20 = iVar20 + iVar6;
    }
    uVar13 = uVar1 & 0xfffffff8;
    uVar8 = uVar1 >> 2 & 1;
    iVar9 = iVar9 * iVar22;
    iVar16 = (uVar1 >> 3) * iVar9 * 8;
    iVar22 = iVar9 * 4;
    iVar18 = (uVar13 + 1) * iVar9;
    iVar15 = (uVar13 + 2) * iVar9;
    iVar21 = (uVar13 + 3) * iVar9;
    for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
      iVar6 = uVar13 + (int)uVar12 * 4;
      Mat::channel((Mat *)&pd,this_00,(iVar6 % 8 >> 2) + iVar6 / 8);
      puVar24 = (undefined4 *)pd.params[0]._0_8_;
      Mat::~Mat((Mat *)&pd);
      for (lVar11 = 0; iVar5 != (int)lVar11; lVar11 = lVar11 + 1) {
        *puVar24 = *(undefined4 *)(lVar3 + (long)iVar16 * 4 + lVar11 * 4);
        puVar24[1] = *(undefined4 *)(lVar3 + (long)iVar18 * 4 + lVar11 * 4);
        puVar24[2] = *(undefined4 *)(lVar3 + (long)iVar15 * 4 + lVar11 * 4);
        puVar24[3] = *(undefined4 *)(lVar3 + (long)iVar21 * 4 + lVar11 * 4);
        puVar24 = puVar24 + 4;
      }
      iVar16 = iVar16 + iVar22;
      iVar18 = iVar18 + iVar22;
      iVar15 = iVar15 + iVar22;
      iVar21 = iVar21 + iVar22;
    }
    iVar22 = uVar13 + uVar8 * 4;
    iVar9 = iVar9 * iVar22;
    for (uVar12 = (ulong)iVar22; (long)uVar12 < (long)(int)uVar1; uVar12 = uVar12 + 1) {
      uVar8 = (int)uVar12 >> 0x1f;
      uVar25 = (ulong)uVar8 << 0x20 | uVar12 & 0xffffffff;
      Mat::channel((Mat *)&pd,this_00,
                   (int)((long)((ulong)uVar8 << 0x20 | uVar12 & 0xffffffff) % 4) +
                   (int)((long)uVar25 / 8) + (int)(char)((char)((long)uVar25 % 8) / '\x04'));
      uVar4 = pd.params[0]._0_8_;
      Mat::~Mat((Mat *)&pd);
      for (lVar11 = 0; iVar5 != (int)lVar11; lVar11 = lVar11 + 1) {
        *(undefined4 *)(uVar4 + lVar11 * 4) = *(undefined4 *)(lVar3 + (long)iVar9 * 4 + lVar11 * 4);
      }
      iVar9 = iVar9 + iVar23;
    }
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt_cpu);
    }

    use_winograd3x3 = false;

    if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        int num_input = weight_data_size / 9 / num_output;
        // winograd is slow on small channel count
        if(num_input >= 16 && num_output >= 16)
            use_winograd3x3 = false;
    }           

    if (use_winograd3x3)
    {
        int num_input = weight_data_size / 9 / num_output;

        if (use_int8_inference)
            // conv3x3s1_winograd23_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_int8_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
        else
            // conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
            conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_3x3_winograd23_data, num_input, num_output);
    }

    if (use_int8_inference == false)
    {
        int kernel_size = kernel_w * kernel_h;
        int num_input = weight_data_size / kernel_size / num_output;

        conv_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_size);
    }       

    return 0;
}